

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::ConditionalWorkloadReferenceCase::writeWorkload
          (ConditionalWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  PerfCaseType PVar1;
  
  PVar1 = (this->super_WorkloadReferenceCase).super_ControlStatementCase.super_ShaderPerformanceCase
          .m_caseType;
  std::__ostream_insert<char,std::char_traits<char>>
            (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t",1);
  writeConditionalWorkload(dst,resultVariableName,inputVariableName);
  std::__ostream_insert<char,std::char_traits<char>>
            (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  if ((PVar1 != CASETYPE_VERTEX) && (this->m_isAttributeStable == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\tres.x = fract(res.x);\n",
               0x17);
    return;
  }
  return;
}

Assistant:

void ConditionalWorkloadReferenceCase::writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
{
	bool isVertexCase = m_caseType == CASETYPE_VERTEX;

	dst << "\t";
	writeConditionalWorkload(dst, resultVariableName, inputVariableName);
	dst << "\n";

	if (!isVertexCase && !m_isAttributeStable)
	{
		// Corresponds to the fract() done in a real test's fragment case with non-stable attribute.
		dst << "	res.x = fract(res.x);\n";
	}
}